

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  float fVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  byte bVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined4 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2848;
  undefined1 local_2820 [16];
  Geometry *local_2810;
  ulong local_2808;
  ulong local_2800;
  Scene *local_27f8;
  long local_27f0;
  ulong *local_27e8;
  ulong local_27e0;
  long local_27d8;
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  undefined1 local_2770 [16];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  RTCHitN local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined4 local_26f0;
  undefined4 uStack_26ec;
  undefined4 uStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  uint local_26c0;
  uint uStack_26bc;
  uint uStack_26b8;
  uint uStack_26b4;
  uint uStack_26b0;
  uint uStack_26ac;
  uint uStack_26a8;
  uint uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar52 [32];
  
  local_27e8 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar90 = ZEXT3264(auVar48);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar91 = ZEXT3264(auVar49);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar92 = ZEXT3264(auVar50);
  auVar47 = vmulss_avx512f(auVar48._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar65 = auVar47._0_4_;
  auVar51._4_4_ = uVar65;
  auVar51._0_4_ = uVar65;
  auVar51._8_4_ = uVar65;
  auVar51._12_4_ = uVar65;
  auVar51._16_4_ = uVar65;
  auVar51._20_4_ = uVar65;
  auVar51._24_4_ = uVar65;
  auVar51._28_4_ = uVar65;
  auVar47 = vmulss_avx512f(auVar49._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar65 = auVar47._0_4_;
  auVar52._4_4_ = uVar65;
  auVar52._0_4_ = uVar65;
  auVar52._8_4_ = uVar65;
  auVar52._12_4_ = uVar65;
  auVar52._16_4_ = uVar65;
  auVar52._20_4_ = uVar65;
  auVar52._24_4_ = uVar65;
  auVar52._28_4_ = uVar65;
  auVar47 = vmulss_avx512f(auVar50._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar65 = auVar47._0_4_;
  auVar50._4_4_ = uVar65;
  auVar50._0_4_ = uVar65;
  auVar50._8_4_ = uVar65;
  auVar50._12_4_ = uVar65;
  auVar50._16_4_ = uVar65;
  auVar50._20_4_ = uVar65;
  auVar50._24_4_ = uVar65;
  auVar50._28_4_ = uVar65;
  local_2800 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = local_2800 ^ 0x20;
  uVar42 = uVar41 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar69 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar93 = ZEXT3264(auVar48);
  auVar49 = vxorps_avx512vl(auVar51,auVar48);
  auVar94 = ZEXT3264(auVar49);
  auVar49 = vxorps_avx512vl(auVar52,auVar48);
  auVar95 = ZEXT3264(auVar49);
  auVar48 = vxorps_avx512vl(auVar50,auVar48);
  auVar96 = ZEXT3264(auVar48);
  auVar48 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar97 = ZEXT3264(auVar48);
  auVar47 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar98 = ZEXT1664(auVar47);
  auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar99 = ZEXT3264(auVar48);
  auVar48 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar100 = ZEXT3264(auVar48);
  auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar101 = ZEXT1664(auVar47);
  auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar102 = ZEXT3264(auVar48);
  local_27e0 = uVar41;
LAB_01dacaf6:
  do {
    if (local_27e8 == &local_23a0) {
      return;
    }
    pfVar5 = (float *)(local_27e8 + -1);
    local_27e8 = local_27e8 + -2;
  } while (*(float *)(ray + k * 4 + 0x80) < *pfVar5);
  uVar43 = *local_27e8;
LAB_01dacb20:
  do {
    if ((uVar43 & 8) != 0) break;
    auVar48 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + local_2800),auVar94._0_32_,
                         auVar90._0_32_);
    auVar49 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + uVar41),auVar95._0_32_,
                         auVar91._0_32_);
    auVar48 = vpmaxsd_avx2(auVar48,auVar49);
    auVar49 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + uVar39),auVar96._0_32_,
                         auVar92._0_32_);
    auVar49 = vpmaxsd_avx512vl(auVar49,auVar97._0_32_);
    auVar48 = vpmaxsd_avx2(auVar48,auVar49);
    auVar49 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + uVar44),auVar94._0_32_,
                         auVar90._0_32_);
    auVar50 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + uVar42),auVar95._0_32_,
                         auVar91._0_32_);
    auVar49 = vpminsd_avx2(auVar49,auVar50);
    auVar50 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar39 ^ 0x20)),auVar96._0_32_,
                         auVar92._0_32_);
    auVar50 = vpminsd_avx2(auVar50,auVar69._0_32_);
    auVar49 = vpminsd_avx2(auVar49,auVar50);
    uVar46 = vpcmpd_avx512vl(auVar48,auVar49,2);
    bVar37 = (byte)uVar46;
    if (bVar37 == 0) goto LAB_01dacaf6;
    auVar49 = *(undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0);
    auVar50 = ((undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0))[1];
    auVar51 = vmovdqa64_avx512vl(auVar99._0_32_);
    auVar51 = vpternlogd_avx512vl(auVar51,auVar48,auVar100._0_32_,0xf8);
    auVar52 = vpcompressd_avx512vl(auVar51);
    auVar53._0_4_ = (uint)(bVar37 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar51._0_4_;
    bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
    auVar53._4_4_ = (uint)bVar45 * auVar52._4_4_ | (uint)!bVar45 * auVar51._4_4_;
    bVar45 = (bool)((byte)(uVar46 >> 2) & 1);
    auVar53._8_4_ = (uint)bVar45 * auVar52._8_4_ | (uint)!bVar45 * auVar51._8_4_;
    bVar45 = (bool)((byte)(uVar46 >> 3) & 1);
    auVar53._12_4_ = (uint)bVar45 * auVar52._12_4_ | (uint)!bVar45 * auVar51._12_4_;
    bVar45 = (bool)((byte)(uVar46 >> 4) & 1);
    auVar53._16_4_ = (uint)bVar45 * auVar52._16_4_ | (uint)!bVar45 * auVar51._16_4_;
    bVar45 = (bool)((byte)(uVar46 >> 5) & 1);
    auVar53._20_4_ = (uint)bVar45 * auVar52._20_4_ | (uint)!bVar45 * auVar51._20_4_;
    bVar45 = (bool)((byte)(uVar46 >> 6) & 1);
    auVar53._24_4_ = (uint)bVar45 * auVar52._24_4_ | (uint)!bVar45 * auVar51._24_4_;
    bVar45 = SUB81(uVar46 >> 7,0);
    auVar53._28_4_ = (uint)bVar45 * auVar52._28_4_ | (uint)!bVar45 * auVar51._28_4_;
    auVar51 = vpermt2q_avx512vl(auVar49,auVar53,auVar50);
    uVar43 = auVar51._0_8_;
    bVar37 = bVar37 - 1 & bVar37;
    if (bVar37 != 0) {
      auVar51 = vpshufd_avx2(auVar53,0x55);
      vpermt2q_avx512vl(auVar49,auVar51,auVar50);
      auVar52 = vpminsd_avx2(auVar53,auVar51);
      auVar51 = vpmaxsd_avx2(auVar53,auVar51);
      bVar37 = bVar37 - 1 & bVar37;
      if (bVar37 == 0) {
        auVar52 = vpermi2q_avx512vl(auVar52,auVar49,auVar50);
        uVar43 = auVar52._0_8_;
        auVar49 = vpermt2q_avx512vl(auVar49,auVar51,auVar50);
        *local_27e8 = auVar49._0_8_;
        lVar33 = 8;
        lStack_2848 = 0x10;
      }
      else {
        auVar60 = vpshufd_avx2(auVar53,0xaa);
        vpermt2q_avx512vl(auVar49,auVar60,auVar50);
        auVar54 = vpminsd_avx2(auVar52,auVar60);
        auVar52 = vpmaxsd_avx2(auVar52,auVar60);
        auVar60 = vpminsd_avx2(auVar51,auVar52);
        auVar52 = vpmaxsd_avx2(auVar51,auVar52);
        bVar37 = bVar37 - 1 & bVar37;
        if (bVar37 == 0) {
          auVar51 = vpermi2q_avx512vl(auVar54,auVar49,auVar50);
          uVar43 = auVar51._0_8_;
          auVar51 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
          *local_27e8 = auVar51._0_8_;
          auVar51 = vpermd_avx2(auVar52,auVar48);
          *(int *)(local_27e8 + 1) = auVar51._0_4_;
          auVar49 = vpermt2q_avx512vl(auVar49,auVar60,auVar50);
          local_27e8[2] = auVar49._0_8_;
          lStack_2848 = 0x18;
          lVar33 = lStack_2848;
          lStack_2848 = 0x20;
          auVar51 = auVar60;
        }
        else {
          auVar51 = vpshufd_avx2(auVar53,0xff);
          vpermt2q_avx512vl(auVar49,auVar51,auVar50);
          auVar58 = vpminsd_avx2(auVar54,auVar51);
          auVar54 = vpmaxsd_avx2(auVar54,auVar51);
          auVar51 = vpminsd_avx2(auVar60,auVar54);
          auVar54 = vpmaxsd_avx2(auVar60,auVar54);
          auVar60 = vpminsd_avx2(auVar52,auVar54);
          auVar52 = vpmaxsd_avx2(auVar52,auVar54);
          bVar37 = bVar37 - 1 & bVar37;
          if (bVar37 != 0) {
            auVar55 = valignd_avx512vl(auVar53,auVar53,3);
            auVar56 = vmovdqa64_avx512vl(auVar101._0_32_);
            auVar54 = vmovdqa64_avx512vl(auVar101._0_32_);
            auVar57 = vmovdqa64_avx512vl(auVar102._0_32_);
            auVar58 = vpermt2d_avx512vl(auVar54,auVar102._0_32_,auVar58);
            auVar54 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar51 = vpermt2d_avx512vl(auVar58,auVar54,auVar51);
            auVar54 = vpermt2d_avx512vl(auVar51,auVar54,auVar60);
            auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar51 = vpermt2d_avx512vl(auVar54,auVar51,auVar52);
            auVar101 = ZEXT3264(auVar51);
            bVar35 = bVar37;
            do {
              auVar52 = auVar101._0_32_;
              auVar77._8_4_ = 1;
              auVar77._0_8_ = 0x100000001;
              auVar77._12_4_ = 1;
              auVar77._16_4_ = 1;
              auVar77._20_4_ = 1;
              auVar77._24_4_ = 1;
              auVar77._28_4_ = 1;
              auVar51 = vpermd_avx2(auVar77,auVar55);
              auVar55 = valignd_avx512vl(auVar55,auVar55,1);
              vpermt2q_avx512vl(auVar49,auVar55,auVar50);
              bVar35 = bVar35 - 1 & bVar35;
              uVar25 = vpcmpd_avx512vl(auVar51,auVar52,5);
              auVar51 = vpmaxsd_avx2(auVar51,auVar52);
              bVar26 = (byte)uVar25 << 1;
              auVar52 = valignd_avx512vl(auVar52,auVar52,7);
              bVar45 = (bool)((byte)uVar25 & 1);
              bVar10 = (bool)(bVar26 >> 2 & 1);
              bVar11 = (bool)(bVar26 >> 3 & 1);
              bVar12 = (bool)(bVar26 >> 4 & 1);
              bVar13 = (bool)(bVar26 >> 5 & 1);
              bVar14 = (bool)(bVar26 >> 6 & 1);
              auVar101 = ZEXT3264(CONCAT428((uint)(bVar26 >> 7) * auVar52._28_4_ |
                                            (uint)!(bool)(bVar26 >> 7) * auVar51._28_4_,
                                            CONCAT424((uint)bVar14 * auVar52._24_4_ |
                                                      (uint)!bVar14 * auVar51._24_4_,
                                                      CONCAT420((uint)bVar13 * auVar52._20_4_ |
                                                                (uint)!bVar13 * auVar51._20_4_,
                                                                CONCAT416((uint)bVar12 *
                                                                          auVar52._16_4_ |
                                                                          (uint)!bVar12 *
                                                                          auVar51._16_4_,
                                                                          CONCAT412((uint)bVar11 *
                                                                                    auVar52._12_4_ |
                                                                                    (uint)!bVar11 *
                                                                                    auVar51._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar10 * auVar52._8_4_ |
                                                  (uint)!bVar10 * auVar51._8_4_,
                                                  CONCAT44((uint)bVar45 * auVar52._4_4_ |
                                                           (uint)!bVar45 * auVar51._4_4_,
                                                           auVar51._0_4_))))))));
            } while (bVar35 != 0);
            lVar33 = (ulong)(uint)POPCOUNT((uint)bVar37) + 3;
            while( true ) {
              auVar52 = auVar101._0_32_;
              auVar51 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
              uVar43 = auVar51._0_8_;
              bVar45 = lVar33 == 0;
              lVar33 = lVar33 + -1;
              if (bVar45) break;
              *local_27e8 = uVar43;
              auVar51 = vpermd_avx2(auVar52,auVar48);
              *(int *)(local_27e8 + 1) = auVar51._0_4_;
              auVar51 = valignd_avx512vl(auVar52,auVar52,1);
              auVar101 = ZEXT3264(auVar51);
              local_27e8 = local_27e8 + 2;
            }
            auVar48 = vmovdqa64_avx512vl(auVar56);
            auVar101 = ZEXT3264(auVar48);
            auVar48 = vmovdqa64_avx512vl(auVar57);
            auVar102 = ZEXT3264(auVar48);
            goto LAB_01dacb20;
          }
          auVar54 = vpermi2q_avx512vl(auVar58,auVar49,auVar50);
          uVar43 = auVar54._0_8_;
          auVar54 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
          *local_27e8 = auVar54._0_8_;
          auVar52 = vpermd_avx2(auVar52,auVar48);
          *(int *)(local_27e8 + 1) = auVar52._0_4_;
          auVar52 = vpermt2q_avx512vl(auVar49,auVar60,auVar50);
          local_27e8[2] = auVar52._0_8_;
          auVar52 = vpermd_avx2(auVar60,auVar48);
          *(int *)(local_27e8 + 3) = auVar52._0_4_;
          auVar49 = vpermt2q_avx512vl(auVar49,auVar51,auVar50);
          local_27e8[4] = auVar49._0_8_;
          lVar33 = 0x28;
          lStack_2848 = 0x30;
        }
      }
      auVar48 = vpermd_avx2(auVar51,auVar48);
      *(int *)((long)local_27e8 + lVar33) = auVar48._0_4_;
      local_27e8 = (ulong *)((long)local_27e8 + lStack_2848);
    }
  } while( true );
  local_27d8 = (ulong)((uint)uVar43 & 0xf) - 8;
  uVar43 = uVar43 & 0xfffffffffffffff0;
  for (local_27f0 = 0; local_27f0 != local_27d8; local_27f0 = local_27f0 + 1) {
    lVar34 = local_27f0 * 0x60;
    local_27f8 = context->scene;
    ppfVar4 = (local_27f8->vertices).items;
    pfVar5 = ppfVar4[*(uint *)(uVar43 + 0x48 + lVar34)];
    auVar70._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x28 + lVar34));
    auVar70._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 8 + lVar34));
    pfVar6 = ppfVar4[*(uint *)(uVar43 + 0x40 + lVar34)];
    auVar72._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x20 + lVar34));
    auVar72._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + lVar34));
    pfVar7 = ppfVar4[*(uint *)(uVar43 + 0x4c + lVar34)];
    auVar79._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x2c + lVar34));
    auVar79._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0xc + lVar34));
    pfVar8 = ppfVar4[*(uint *)(uVar43 + 0x44 + lVar34)];
    auVar83._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x24 + lVar34));
    auVar83._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 4 + lVar34));
    lVar33 = uVar43 + 0x40 + lVar34;
    local_25a0 = *(undefined8 *)(lVar33 + 0x10);
    uStack_2598 = *(undefined8 *)(lVar33 + 0x18);
    uStack_2590 = local_25a0;
    uStack_2588 = uStack_2598;
    lVar33 = uVar43 + 0x50 + lVar34;
    local_2760 = *(undefined8 *)(lVar33 + 0x10);
    uStack_2758 = *(undefined8 *)(lVar33 + 0x18);
    auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar34)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x18 + lVar34)));
    auVar47 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar34)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x18 + lVar34)));
    auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x1c + lVar34)));
    auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x1c + lVar34)));
    auVar18 = vunpcklps_avx(auVar47,auVar15);
    auVar19 = vunpcklps_avx(auVar16,auVar17);
    auVar47 = vunpckhps_avx(auVar16,auVar17);
    auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar34)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x38 + lVar34)));
    auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar34)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x38 + lVar34)));
    auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar34)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x3c + lVar34)));
    auVar16 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar34)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x3c + lVar34)));
    auVar16 = vunpcklps_avx(auVar15,auVar16);
    auVar21 = vunpcklps_avx(auVar17,auVar20);
    auVar15 = vunpckhps_avx(auVar17,auVar20);
    uStack_2750 = local_2760;
    uStack_2748 = uStack_2758;
    auVar48 = vunpcklps_avx(auVar83,auVar79);
    auVar49 = vunpcklps_avx(auVar72,auVar70);
    auVar58 = vunpcklps_avx(auVar49,auVar48);
    auVar60 = vunpckhps_avx(auVar49,auVar48);
    auVar48 = vunpckhps_avx(auVar83,auVar79);
    auVar49 = vunpckhps_avx(auVar72,auVar70);
    auVar56 = vunpcklps_avx(auVar49,auVar48);
    auVar48._16_16_ = auVar19;
    auVar48._0_16_ = auVar19;
    auVar49._16_16_ = auVar47;
    auVar49._0_16_ = auVar47;
    auVar62._16_16_ = auVar18;
    auVar62._0_16_ = auVar18;
    auVar80._16_16_ = auVar21;
    auVar80._0_16_ = auVar21;
    auVar78._16_16_ = auVar15;
    auVar78._0_16_ = auVar15;
    auVar54._16_16_ = auVar16;
    auVar54._0_16_ = auVar16;
    auVar48 = vsubps_avx(auVar58,auVar48);
    auVar49 = vsubps_avx(auVar60,auVar49);
    auVar50 = vsubps_avx(auVar56,auVar62);
    auVar51 = vsubps_avx(auVar80,auVar58);
    auVar52 = vsubps_avx(auVar78,auVar60);
    auVar54 = vsubps_avx(auVar54,auVar56);
    auVar55._4_4_ = auVar49._4_4_ * auVar54._4_4_;
    auVar55._0_4_ = auVar49._0_4_ * auVar54._0_4_;
    auVar55._8_4_ = auVar49._8_4_ * auVar54._8_4_;
    auVar55._12_4_ = auVar49._12_4_ * auVar54._12_4_;
    auVar55._16_4_ = auVar49._16_4_ * auVar54._16_4_;
    auVar55._20_4_ = auVar49._20_4_ * auVar54._20_4_;
    auVar55._24_4_ = auVar49._24_4_ * auVar54._24_4_;
    auVar55._28_4_ = auVar16._12_4_;
    auVar15 = vfmsub231ps_fma(auVar55,auVar52,auVar50);
    auVar59._4_4_ = auVar50._4_4_ * auVar51._4_4_;
    auVar59._0_4_ = auVar50._0_4_ * auVar51._0_4_;
    auVar59._8_4_ = auVar50._8_4_ * auVar51._8_4_;
    auVar59._12_4_ = auVar50._12_4_ * auVar51._12_4_;
    auVar59._16_4_ = auVar50._16_4_ * auVar51._16_4_;
    auVar59._20_4_ = auVar50._20_4_ * auVar51._20_4_;
    auVar59._24_4_ = auVar50._24_4_ * auVar51._24_4_;
    auVar59._28_4_ = auVar18._12_4_;
    auVar16 = vfmsub231ps_fma(auVar59,auVar54,auVar48);
    auVar61._4_4_ = auVar48._4_4_ * auVar52._4_4_;
    auVar61._0_4_ = auVar48._0_4_ * auVar52._0_4_;
    auVar61._8_4_ = auVar48._8_4_ * auVar52._8_4_;
    auVar61._12_4_ = auVar48._12_4_ * auVar52._12_4_;
    auVar61._16_4_ = auVar48._16_4_ * auVar52._16_4_;
    auVar61._20_4_ = auVar48._20_4_ * auVar52._20_4_;
    auVar61._24_4_ = auVar48._24_4_ * auVar52._24_4_;
    auVar61._28_4_ = auVar19._12_4_;
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar84._4_4_ = uVar65;
    auVar84._0_4_ = uVar65;
    auVar84._8_4_ = uVar65;
    auVar84._12_4_ = uVar65;
    auVar84._16_4_ = uVar65;
    auVar84._20_4_ = uVar65;
    auVar84._24_4_ = uVar65;
    auVar84._28_4_ = uVar65;
    auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
    auVar59 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
    uVar65 = *(undefined4 *)(ray + k * 4);
    auVar57._4_4_ = uVar65;
    auVar57._0_4_ = uVar65;
    auVar57._8_4_ = uVar65;
    auVar57._12_4_ = uVar65;
    auVar57._16_4_ = uVar65;
    auVar57._20_4_ = uVar65;
    auVar57._24_4_ = uVar65;
    auVar57._28_4_ = uVar65;
    auVar57 = vsubps_avx512vl(auVar58,auVar57);
    auVar17 = vfmsub231ps_fma(auVar61,auVar51,auVar49);
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar58._4_4_ = uVar65;
    auVar58._0_4_ = uVar65;
    auVar58._8_4_ = uVar65;
    auVar58._12_4_ = uVar65;
    auVar58._16_4_ = uVar65;
    auVar58._20_4_ = uVar65;
    auVar58._24_4_ = uVar65;
    auVar58._28_4_ = uVar65;
    auVar58 = vsubps_avx512vl(auVar60,auVar58);
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x20);
    auVar60._4_4_ = uVar65;
    auVar60._0_4_ = uVar65;
    auVar60._8_4_ = uVar65;
    auVar60._12_4_ = uVar65;
    auVar60._16_4_ = uVar65;
    auVar60._20_4_ = uVar65;
    auVar60._24_4_ = uVar65;
    auVar60._28_4_ = uVar65;
    auVar60 = vsubps_avx512vl(auVar56,auVar60);
    auVar56 = vmulps_avx512vl(auVar55,auVar60);
    auVar61 = vfmsub231ps_avx512vl(auVar56,auVar58,auVar59);
    auVar56 = vmulps_avx512vl(auVar59,auVar57);
    auVar18 = vfmsub231ps_fma(auVar56,auVar60,auVar84);
    auVar56 = vmulps_avx512vl(auVar84,auVar58);
    auVar62 = vfmsub231ps_avx512vl(auVar56,auVar57,auVar55);
    auVar56 = vmulps_avx512vl(ZEXT1632(auVar17),auVar59);
    auVar56 = vfmadd231ps_avx512vl(auVar56,ZEXT1632(auVar16),auVar55);
    local_2520 = vfmadd231ps_avx512vl(auVar56,ZEXT1632(auVar15),auVar84);
    auVar56._8_4_ = 0x7fffffff;
    auVar56._0_8_ = 0x7fffffff7fffffff;
    auVar56._12_4_ = 0x7fffffff;
    auVar56._16_4_ = 0x7fffffff;
    auVar56._20_4_ = 0x7fffffff;
    auVar56._24_4_ = 0x7fffffff;
    auVar56._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar56);
    vandps_avx512vl(local_2520,auVar93._0_32_);
    auVar54 = vmulps_avx512vl(auVar54,auVar62);
    auVar47 = vfmadd231ps_fma(auVar54,ZEXT1632(auVar18),auVar52);
    auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar61,auVar51);
    fVar71 = local_2520._0_4_;
    local_2580._0_4_ = (float)((uint)fVar71 ^ auVar47._0_4_);
    fVar74 = local_2520._4_4_;
    local_2580._4_4_ = (float)((uint)fVar74 ^ auVar47._4_4_);
    fVar75 = local_2520._8_4_;
    local_2580._8_4_ = (float)((uint)fVar75 ^ auVar47._8_4_);
    fVar76 = local_2520._12_4_;
    local_2580._12_4_ = (float)((uint)fVar76 ^ auVar47._12_4_);
    fVar85 = local_2520._16_4_;
    local_2580._16_4_ = fVar85;
    fVar86 = local_2520._20_4_;
    local_2580._20_4_ = fVar86;
    fVar87 = local_2520._24_4_;
    local_2580._24_4_ = fVar87;
    fVar88 = local_2520._28_4_;
    local_2580._28_4_ = fVar88;
    auVar50 = vmulps_avx512vl(auVar50,auVar62);
    auVar47 = vfmadd231ps_fma(auVar50,auVar49,ZEXT1632(auVar18));
    auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar48,auVar61);
    local_2560._0_4_ = (float)((uint)fVar71 ^ auVar47._0_4_);
    local_2560._4_4_ = (float)((uint)fVar74 ^ auVar47._4_4_);
    local_2560._8_4_ = (float)((uint)fVar75 ^ auVar47._8_4_);
    local_2560._12_4_ = (float)((uint)fVar76 ^ auVar47._12_4_);
    local_2560._16_4_ = fVar85;
    local_2560._20_4_ = fVar86;
    local_2560._24_4_ = fVar87;
    local_2560._28_4_ = fVar88;
    uVar25 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
    uVar22 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
    uVar23 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
    auVar89._0_4_ = local_2580._0_4_ + local_2560._0_4_;
    auVar89._4_4_ = local_2580._4_4_ + local_2560._4_4_;
    auVar89._8_4_ = local_2580._8_4_ + local_2560._8_4_;
    auVar89._12_4_ = local_2580._12_4_ + local_2560._12_4_;
    auVar89._16_4_ = fVar85 + fVar85;
    auVar89._20_4_ = fVar86 + fVar86;
    auVar89._24_4_ = fVar87 + fVar87;
    auVar89._28_4_ = fVar88 + fVar88;
    uVar24 = vcmpps_avx512vl(auVar89,local_2520,2);
    local_24a0 = (byte)uVar25 & (byte)uVar22 & (byte)uVar23 & (byte)uVar24;
    if (local_24a0 != 0) {
      auVar28._4_4_ = auVar60._4_4_ * auVar17._4_4_;
      auVar28._0_4_ = auVar60._0_4_ * auVar17._0_4_;
      auVar28._8_4_ = auVar60._8_4_ * auVar17._8_4_;
      auVar28._12_4_ = auVar60._12_4_ * auVar17._12_4_;
      auVar28._16_4_ = auVar60._16_4_ * 0.0;
      auVar28._20_4_ = auVar60._20_4_ * 0.0;
      auVar28._24_4_ = auVar60._24_4_ * 0.0;
      auVar28._28_4_ = auVar60._28_4_;
      auVar47 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar16),auVar28);
      auVar47 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar15),ZEXT1632(auVar47));
      local_2540._0_4_ = (float)((uint)fVar71 ^ auVar47._0_4_);
      local_2540._4_4_ = (float)((uint)fVar74 ^ auVar47._4_4_);
      local_2540._8_4_ = (float)((uint)fVar75 ^ auVar47._8_4_);
      local_2540._12_4_ = (float)((uint)fVar76 ^ auVar47._12_4_);
      local_2540._16_4_ = fVar85;
      local_2540._20_4_ = fVar86;
      local_2540._24_4_ = fVar87;
      local_2540._28_4_ = fVar88;
      uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar27._4_4_ = uVar65;
      auVar27._0_4_ = uVar65;
      auVar27._8_4_ = uVar65;
      auVar27._12_4_ = uVar65;
      auVar27._16_4_ = uVar65;
      auVar27._20_4_ = uVar65;
      auVar27._24_4_ = uVar65;
      auVar27._28_4_ = uVar65;
      auVar48 = vmulps_avx512vl(local_2520,auVar27);
      uVar25 = vcmpps_avx512vl(auVar48,local_2540,1);
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      auVar69 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(
                                                  fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
      auVar29._4_4_ = fVar2 * fVar74;
      auVar29._0_4_ = fVar2 * fVar71;
      auVar29._8_4_ = fVar2 * fVar75;
      auVar29._12_4_ = fVar2 * fVar76;
      auVar29._16_4_ = fVar2 * fVar85;
      auVar29._20_4_ = fVar2 * fVar86;
      auVar29._24_4_ = fVar2 * fVar87;
      auVar29._28_4_ = auVar48._28_4_;
      uVar22 = vcmpps_avx512vl(local_2540,auVar29,2);
      local_24a0 = (byte)uVar25 & (byte)uVar22 & local_24a0;
      uVar41 = (ulong)local_24a0;
      if (local_24a0 != 0) {
        local_2500 = ZEXT1632(auVar15);
        local_24e0 = ZEXT1632(auVar16);
        local_24c0 = ZEXT1632(auVar17);
        local_23c0 = 0xf0;
        auVar48 = vrcp14ps_avx512vl(local_2520);
        auVar82._8_4_ = 0x3f800000;
        auVar82._0_8_ = 0x3f8000003f800000;
        auVar82._12_4_ = 0x3f800000;
        auVar82._16_4_ = 0x3f800000;
        auVar82._20_4_ = 0x3f800000;
        auVar82._24_4_ = 0x3f800000;
        auVar82._28_4_ = 0x3f800000;
        auVar47 = vfnmadd213ps_fma(local_2520,auVar48,auVar82);
        auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar48,auVar48);
        fVar71 = auVar47._0_4_;
        fVar74 = auVar47._4_4_;
        local_2440._4_4_ = fVar74 * local_2540._4_4_;
        local_2440._0_4_ = fVar71 * local_2540._0_4_;
        fVar75 = auVar47._8_4_;
        local_2440._8_4_ = fVar75 * local_2540._8_4_;
        fVar76 = auVar47._12_4_;
        local_2440._12_4_ = fVar76 * local_2540._12_4_;
        local_2440._16_4_ = fVar85 * 0.0;
        local_2440._20_4_ = fVar86 * 0.0;
        local_2440._24_4_ = fVar87 * 0.0;
        local_2440._28_4_ = auVar48._28_4_;
        auVar81 = ZEXT3264(local_2440);
        auVar30._4_4_ = fVar74 * local_2580._4_4_;
        auVar30._0_4_ = fVar71 * local_2580._0_4_;
        auVar30._8_4_ = fVar75 * local_2580._8_4_;
        auVar30._12_4_ = fVar76 * local_2580._12_4_;
        auVar30._16_4_ = fVar85 * 0.0;
        auVar30._20_4_ = fVar86 * 0.0;
        auVar30._24_4_ = fVar87 * 0.0;
        auVar30._28_4_ = fVar88;
        auVar48 = vminps_avx(auVar30,auVar82);
        auVar73._0_4_ = fVar71 * local_2560._0_4_;
        auVar73._4_4_ = fVar74 * local_2560._4_4_;
        auVar73._8_4_ = fVar75 * local_2560._8_4_;
        auVar73._12_4_ = fVar76 * local_2560._12_4_;
        auVar73._16_4_ = fVar85 * 0.0;
        auVar73._20_4_ = fVar86 * 0.0;
        auVar73._24_4_ = fVar87 * 0.0;
        auVar73._28_4_ = 0;
        auVar49 = vminps_avx(auVar73,auVar82);
        auVar50 = vsubps_avx(auVar82,auVar48);
        auVar51 = vsubps_avx(auVar82,auVar49);
        local_2460 = vblendps_avx(auVar49,auVar50,0xf0);
        local_2480 = vblendps_avx(auVar48,auVar51,0xf0);
        fVar71 = (float)DAT_01fbac00;
        local_2420._0_4_ = auVar15._0_4_ * fVar71;
        fVar74 = DAT_01fbac00._4_4_;
        local_2420._4_4_ = auVar15._4_4_ * fVar74;
        fVar75 = DAT_01fbac00._8_4_;
        local_2420._8_4_ = auVar15._8_4_ * fVar75;
        fVar76 = DAT_01fbac00._12_4_;
        local_2420._12_4_ = auVar15._12_4_ * fVar76;
        fVar85 = DAT_01fbac00._16_4_;
        local_2420._16_4_ = fVar85 * 0.0;
        fVar86 = DAT_01fbac00._20_4_;
        local_2420._20_4_ = fVar86 * 0.0;
        fVar87 = DAT_01fbac00._24_4_;
        local_2420._24_4_ = fVar87 * 0.0;
        local_2420._28_4_ = 0;
        local_2400._0_4_ = auVar16._0_4_ * fVar71;
        local_2400._4_4_ = auVar16._4_4_ * fVar74;
        local_2400._8_4_ = auVar16._8_4_ * fVar75;
        local_2400._12_4_ = auVar16._12_4_ * fVar76;
        local_2400._16_4_ = fVar85 * 0.0;
        local_2400._20_4_ = fVar86 * 0.0;
        local_2400._24_4_ = fVar87 * 0.0;
        local_2400._28_4_ = 0;
        local_23e0._4_4_ = auVar17._4_4_ * fVar74;
        local_23e0._0_4_ = auVar17._0_4_ * fVar71;
        local_23e0._8_4_ = auVar17._8_4_ * fVar75;
        local_23e0._12_4_ = auVar17._12_4_ * fVar76;
        local_23e0._16_4_ = fVar85 * 0.0;
        local_23e0._20_4_ = fVar86 * 0.0;
        local_23e0._24_4_ = fVar87 * 0.0;
        local_23e0._28_4_ = 0;
        auVar66._8_4_ = 0x7f800000;
        auVar66._0_8_ = 0x7f8000007f800000;
        auVar66._12_4_ = 0x7f800000;
        auVar66._16_4_ = 0x7f800000;
        auVar66._20_4_ = 0x7f800000;
        auVar66._24_4_ = 0x7f800000;
        auVar66._28_4_ = 0x7f800000;
        auVar48 = vblendmps_avx512vl(auVar66,local_2440);
        auVar63._0_4_ =
             (uint)(local_24a0 & 1) * auVar48._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 1 & 1);
        auVar63._4_4_ = (uint)bVar45 * auVar48._4_4_ | (uint)!bVar45 * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 2 & 1);
        auVar63._8_4_ = (uint)bVar45 * auVar48._8_4_ | (uint)!bVar45 * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 3 & 1);
        auVar63._12_4_ = (uint)bVar45 * auVar48._12_4_ | (uint)!bVar45 * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 4 & 1);
        auVar63._16_4_ = (uint)bVar45 * auVar48._16_4_ | (uint)!bVar45 * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 5 & 1);
        auVar63._20_4_ = (uint)bVar45 * auVar48._20_4_ | (uint)!bVar45 * 0x7f800000;
        bVar45 = (bool)(local_24a0 >> 6 & 1);
        auVar63._24_4_ = (uint)bVar45 * auVar48._24_4_ | (uint)!bVar45 * 0x7f800000;
        auVar63._28_4_ =
             (uint)(local_24a0 >> 7) * auVar48._28_4_ | (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
        auVar48 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar48 = vminps_avx(auVar63,auVar48);
        auVar49 = vshufpd_avx(auVar48,auVar48,5);
        auVar48 = vminps_avx(auVar48,auVar49);
        auVar49 = vpermpd_avx2(auVar48,0x4e);
        auVar48 = vminps_avx(auVar48,auVar49);
        uVar25 = vcmpps_avx512vl(auVar63,auVar48,0);
        bVar37 = local_24a0;
        if (((byte)uVar25 & local_24a0) != 0) {
          bVar37 = (byte)uVar25 & local_24a0;
        }
        uVar36 = 0;
        for (uVar38 = (uint)bVar37; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
          uVar36 = uVar36 + 1;
        }
        do {
          uVar40 = uVar36 & 0xff;
          local_2808 = (ulong)uVar40;
          uVar38 = *(uint *)((long)&local_25a0 + local_2808 * 4);
          local_2810 = (local_27f8->geometries).items[uVar38].ptr;
          if ((local_2810->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar41 = (ulong)(byte)(~(byte)(1 << (uVar36 & 0x1f)) & (byte)uVar41);
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_2810->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar41 = (ulong)(uVar40 << 2);
              uVar65 = *(undefined4 *)(local_2480 + uVar41);
              uVar3 = *(undefined4 *)(local_2460 + uVar41);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar41);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar41);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar41);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar41);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar65;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_2760 + uVar41);
              *(uint *)(ray + k * 4 + 0x120) = uVar38;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              break;
            }
            local_26a0 = auVar81._0_32_;
            local_27a0 = auVar69._0_32_;
            local_2680 = vmovdqa64_avx512vl(auVar97._0_32_);
            local_2660 = auVar96._0_32_;
            local_2640 = auVar95._0_32_;
            local_2620 = auVar94._0_32_;
            local_2600 = auVar92._0_32_;
            local_25e0 = auVar91._0_32_;
            local_25c0 = auVar90._0_32_;
            uVar46 = (ulong)(uVar40 * 4);
            uVar65 = *(undefined4 *)(local_2480 + uVar46);
            local_2700._4_4_ = uVar65;
            local_2700._0_4_ = uVar65;
            local_2700._8_4_ = uVar65;
            local_2700._12_4_ = uVar65;
            local_26f0 = *(undefined4 *)(local_2460 + uVar46);
            local_26d0 = vpbroadcastd_avx512vl();
            uVar65 = *(undefined4 *)((long)&local_2760 + uVar46);
            local_26e0._4_4_ = uVar65;
            local_26e0._0_4_ = uVar65;
            local_26e0._8_4_ = uVar65;
            local_26e0._12_4_ = uVar65;
            uVar65 = *(undefined4 *)(local_2420 + uVar46);
            uVar3 = *(undefined4 *)(local_2400 + uVar46);
            local_2720._4_4_ = uVar3;
            local_2720._0_4_ = uVar3;
            local_2720._8_4_ = uVar3;
            local_2720._12_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_23e0 + uVar46);
            local_2710._4_4_ = uVar3;
            local_2710._0_4_ = uVar3;
            local_2710._8_4_ = uVar3;
            local_2710._12_4_ = uVar3;
            local_2730[0] = (RTCHitN)(char)uVar65;
            local_2730[1] = (RTCHitN)(char)((uint)uVar65 >> 8);
            local_2730[2] = (RTCHitN)(char)((uint)uVar65 >> 0x10);
            local_2730[3] = (RTCHitN)(char)((uint)uVar65 >> 0x18);
            local_2730[4] = (RTCHitN)(char)uVar65;
            local_2730[5] = (RTCHitN)(char)((uint)uVar65 >> 8);
            local_2730[6] = (RTCHitN)(char)((uint)uVar65 >> 0x10);
            local_2730[7] = (RTCHitN)(char)((uint)uVar65 >> 0x18);
            local_2730[8] = (RTCHitN)(char)uVar65;
            local_2730[9] = (RTCHitN)(char)((uint)uVar65 >> 8);
            local_2730[10] = (RTCHitN)(char)((uint)uVar65 >> 0x10);
            local_2730[0xb] = (RTCHitN)(char)((uint)uVar65 >> 0x18);
            local_2730[0xc] = (RTCHitN)(char)uVar65;
            local_2730[0xd] = (RTCHitN)(char)((uint)uVar65 >> 8);
            local_2730[0xe] = (RTCHitN)(char)((uint)uVar65 >> 0x10);
            local_2730[0xf] = (RTCHitN)(char)((uint)uVar65 >> 0x18);
            uStack_26ec = local_26f0;
            uStack_26e8 = local_26f0;
            uStack_26e4 = local_26f0;
            vpcmpeqd_avx2(ZEXT1632(local_2700),ZEXT1632(local_2700));
            uStack_26bc = context->user->instID[0];
            local_26c0 = uStack_26bc;
            uStack_26b8 = uStack_26bc;
            uStack_26b4 = uStack_26bc;
            uStack_26b0 = context->user->instPrimID[0];
            uStack_26ac = uStack_26b0;
            uStack_26a8 = uStack_26b0;
            uStack_26a4 = uStack_26b0;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar46);
            auVar47 = auVar98._0_16_;
            local_2820 = vmovdqa64_avx512vl(auVar47);
            local_27d0.valid = (int *)local_2820;
            local_27d0.geometryUserPtr = local_2810->userPtr;
            local_27d0.context = context->user;
            local_27d0.hit = local_2730;
            local_27d0.N = 4;
            local_2770 = vmovdqa64_avx512vl(auVar47);
            auVar47 = vmovdqa64_avx512vl(auVar47);
            local_27d0.ray = (RTCRayN *)ray;
            if (local_2810->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_2810->intersectionFilterN)(&local_27d0);
              auVar47 = local_2820;
            }
            uVar46 = vptestmd_avx512vl(auVar47,auVar47);
            if ((uVar46 & 0xf) == 0) {
LAB_01dad5fd:
              *(undefined4 *)(ray + k * 4 + 0x80) = local_27a0._0_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_2810->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var9)(&local_27d0);
                auVar47 = local_2820;
              }
              uVar46 = vptestmd_avx512vl(auVar47,auVar47);
              uVar46 = uVar46 & 0xf;
              bVar37 = (byte)uVar46;
              if (bVar37 == 0) goto LAB_01dad5fd;
              iVar1 = *(int *)(local_27d0.hit + 4);
              iVar31 = *(int *)(local_27d0.hit + 8);
              iVar32 = *(int *)(local_27d0.hit + 0xc);
              bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
              bVar11 = SUB81(uVar46 >> 3,0);
              *(uint *)(local_27d0.ray + 0xc0) =
                   (uint)(bVar37 & 1) * *(int *)local_27d0.hit |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_27d0.ray + 0xc0);
              *(uint *)(local_27d0.ray + 0xc4) =
                   (uint)bVar45 * iVar1 | (uint)!bVar45 * *(int *)(local_27d0.ray + 0xc4);
              *(uint *)(local_27d0.ray + 200) =
                   (uint)bVar10 * iVar31 | (uint)!bVar10 * *(int *)(local_27d0.ray + 200);
              *(uint *)(local_27d0.ray + 0xcc) =
                   (uint)bVar11 * iVar32 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xcc);
              iVar1 = *(int *)(local_27d0.hit + 0x14);
              iVar31 = *(int *)(local_27d0.hit + 0x18);
              iVar32 = *(int *)(local_27d0.hit + 0x1c);
              bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
              bVar11 = SUB81(uVar46 >> 3,0);
              *(uint *)(local_27d0.ray + 0xd0) =
                   (uint)(bVar37 & 1) * *(int *)(local_27d0.hit + 0x10) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_27d0.ray + 0xd0);
              *(uint *)(local_27d0.ray + 0xd4) =
                   (uint)bVar45 * iVar1 | (uint)!bVar45 * *(int *)(local_27d0.ray + 0xd4);
              *(uint *)(local_27d0.ray + 0xd8) =
                   (uint)bVar10 * iVar31 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xd8);
              *(uint *)(local_27d0.ray + 0xdc) =
                   (uint)bVar11 * iVar32 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xdc);
              iVar1 = *(int *)(local_27d0.hit + 0x24);
              iVar31 = *(int *)(local_27d0.hit + 0x28);
              iVar32 = *(int *)(local_27d0.hit + 0x2c);
              bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
              bVar11 = SUB81(uVar46 >> 3,0);
              *(uint *)(local_27d0.ray + 0xe0) =
                   (uint)(bVar37 & 1) * *(int *)(local_27d0.hit + 0x20) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_27d0.ray + 0xe0);
              *(uint *)(local_27d0.ray + 0xe4) =
                   (uint)bVar45 * iVar1 | (uint)!bVar45 * *(int *)(local_27d0.ray + 0xe4);
              *(uint *)(local_27d0.ray + 0xe8) =
                   (uint)bVar10 * iVar31 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xe8);
              *(uint *)(local_27d0.ray + 0xec) =
                   (uint)bVar11 * iVar32 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xec);
              iVar1 = *(int *)(local_27d0.hit + 0x34);
              iVar31 = *(int *)(local_27d0.hit + 0x38);
              iVar32 = *(int *)(local_27d0.hit + 0x3c);
              bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
              bVar11 = SUB81(uVar46 >> 3,0);
              *(uint *)(local_27d0.ray + 0xf0) =
                   (uint)(bVar37 & 1) * *(int *)(local_27d0.hit + 0x30) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_27d0.ray + 0xf0);
              *(uint *)(local_27d0.ray + 0xf4) =
                   (uint)bVar45 * iVar1 | (uint)!bVar45 * *(int *)(local_27d0.ray + 0xf4);
              *(uint *)(local_27d0.ray + 0xf8) =
                   (uint)bVar10 * iVar31 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xf8);
              *(uint *)(local_27d0.ray + 0xfc) =
                   (uint)bVar11 * iVar32 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xfc);
              iVar1 = *(int *)(local_27d0.hit + 0x44);
              iVar31 = *(int *)(local_27d0.hit + 0x48);
              iVar32 = *(int *)(local_27d0.hit + 0x4c);
              bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
              bVar11 = SUB81(uVar46 >> 3,0);
              *(uint *)(local_27d0.ray + 0x100) =
                   (uint)(bVar37 & 1) * *(int *)(local_27d0.hit + 0x40) |
                   (uint)!(bool)(bVar37 & 1) * *(int *)(local_27d0.ray + 0x100);
              *(uint *)(local_27d0.ray + 0x104) =
                   (uint)bVar45 * iVar1 | (uint)!bVar45 * *(int *)(local_27d0.ray + 0x104);
              *(uint *)(local_27d0.ray + 0x108) =
                   (uint)bVar10 * iVar31 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0x108);
              *(uint *)(local_27d0.ray + 0x10c) =
                   (uint)bVar11 * iVar32 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0x10c);
              auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x50));
              *(undefined1 (*) [16])(local_27d0.ray + 0x110) = auVar47;
              auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x60));
              *(undefined1 (*) [16])(local_27d0.ray + 0x120) = auVar47;
              auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x70));
              *(undefined1 (*) [16])(local_27d0.ray + 0x130) = auVar47;
              auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x80));
              *(undefined1 (*) [16])(local_27d0.ray + 0x140) = auVar47;
              local_27a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            }
            auVar69 = ZEXT3264(local_27a0);
            uVar65 = local_27a0._0_4_;
            auVar68._4_4_ = uVar65;
            auVar68._0_4_ = uVar65;
            auVar68._8_4_ = uVar65;
            auVar68._12_4_ = uVar65;
            auVar68._16_4_ = uVar65;
            auVar68._20_4_ = uVar65;
            auVar68._24_4_ = uVar65;
            auVar68._28_4_ = uVar65;
            auVar81 = ZEXT3264(local_26a0);
            uVar46 = vcmpps_avx512vl(local_26a0,auVar68,2);
            uVar41 = (byte)(~(byte)(1 << ((uint)local_2808 & 0x1f)) & (byte)uVar41) & uVar46;
            auVar90 = ZEXT3264(local_25c0);
            auVar91 = ZEXT3264(local_25e0);
            auVar92 = ZEXT3264(local_2600);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar93 = ZEXT3264(auVar48);
            auVar94 = ZEXT3264(local_2620);
            auVar95 = ZEXT3264(local_2640);
            auVar96 = ZEXT3264(local_2660);
            auVar48 = vmovdqa64_avx512vl(local_2680);
            auVar97 = ZEXT3264(auVar48);
            auVar47 = vmovdqa64_avx512vl(local_2770);
            auVar98 = ZEXT1664(auVar47);
            auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar99 = ZEXT3264(auVar48);
            auVar48 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar100 = ZEXT3264(auVar48);
            auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar101 = ZEXT1664(auVar47);
            auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar102 = ZEXT3264(auVar48);
          }
          bVar37 = (byte)uVar41;
          if (bVar37 == 0) break;
          auVar67._8_4_ = 0x7f800000;
          auVar67._0_8_ = 0x7f8000007f800000;
          auVar67._12_4_ = 0x7f800000;
          auVar67._16_4_ = 0x7f800000;
          auVar67._20_4_ = 0x7f800000;
          auVar67._24_4_ = 0x7f800000;
          auVar67._28_4_ = 0x7f800000;
          auVar48 = vblendmps_avx512vl(auVar67,auVar81._0_32_);
          auVar64._0_4_ =
               (uint)(bVar37 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar37 & 1) * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar45 * auVar48._4_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar45 * auVar48._8_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar64._12_4_ = (uint)bVar45 * auVar48._12_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar64._16_4_ = (uint)bVar45 * auVar48._16_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar64._20_4_ = (uint)bVar45 * auVar48._20_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar64._24_4_ = (uint)bVar45 * auVar48._24_4_ | (uint)!bVar45 * 0x7f800000;
          bVar45 = SUB81(uVar41 >> 7,0);
          auVar64._28_4_ = (uint)bVar45 * auVar48._28_4_ | (uint)!bVar45 * 0x7f800000;
          auVar48 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar48 = vminps_avx(auVar64,auVar48);
          auVar49 = vshufpd_avx(auVar48,auVar48,5);
          auVar48 = vminps_avx(auVar48,auVar49);
          auVar49 = vpermpd_avx2(auVar48,0x4e);
          auVar48 = vminps_avx(auVar48,auVar49);
          uVar25 = vcmpps_avx512vl(auVar64,auVar48,0);
          bVar37 = (byte)uVar25 & bVar37;
          uVar38 = (uint)uVar41;
          if (bVar37 != 0) {
            uVar38 = (uint)bVar37;
          }
          uVar36 = 0;
          for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
            uVar36 = uVar36 + 1;
          }
        } while( true );
      }
    }
    uVar41 = local_27e0;
  }
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar69 = ZEXT3264(CONCAT428(uVar65,CONCAT424(uVar65,CONCAT420(uVar65,CONCAT416(uVar65,CONCAT412(
                                                  uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65)))))
                                               )));
  goto LAB_01dacaf6;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }